

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestCase * __thiscall Catch::TestCase::operator=(TestCase *this,TestCase *other)

{
  undefined1 local_130 [8];
  TestCase temp;
  TestCase *other_local;
  TestCase *this_local;
  
  temp.test.m_p = (ITestCase *)other;
  TestCase((TestCase *)local_130,other);
  swap(this,(TestCase *)local_130);
  ~TestCase((TestCase *)local_130);
  return this;
}

Assistant:

TestCase& TestCase::operator = ( TestCase const& other ) {
        TestCase temp( other );
        swap( temp );
        return *this;
    }